

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O3

void deqp::gls::ShaderExecUtil::checkExtension(RenderContext *renderCtx,string *extension)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  NotSupportedError *this;
  int iVar3;
  int numExts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar1 = (*renderCtx->_vptr_RenderContext[3])();
  local_40._M_dataplus._M_p._0_4_ = 0;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))(0x821d,&local_40);
  if (0 < (int)local_40._M_dataplus._M_p) {
    iVar3 = 0;
    do {
      (**(code **)(CONCAT44(extraout_var,iVar1) + 0xa80))(0x1f03,iVar3);
      iVar2 = std::__cxx11::string::compare((char *)extension);
      if (iVar2 == 0) {
        return;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < (int)local_40._M_dataplus._M_p);
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::operator+(&local_40,extension," is not supported");
  tcu::NotSupportedError::NotSupportedError(this,&local_40);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

static void checkExtension (const glu::RenderContext& renderCtx, const std::string& extension)
{
	if (!isExtensionSupported(renderCtx, extension))
		throw tcu::NotSupportedError(extension + " is not supported");
}